

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clients_map.c
# Opt level: O1

piga_status piga_clients_map_remove(piga_clients_map *map,int shm_key)

{
  char *pcVar1;
  piga_status in_EAX;
  long lVar2;
  
  lVar2 = 0x58;
  do {
    if ((*(long *)(map->items[0].name + lVar2) == 0) &&
       (*(int *)(map->items[0].name + lVar2 + -8) == shm_key)) {
      in_EAX = piga_event_queue_disconnect_from_shm();
      pcVar1 = map->items[0].name + lVar2;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      pcVar1 = map->items[0].name + lVar2 + -8;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
    }
    lVar2 = lVar2 + 0x60;
  } while (lVar2 != 0x358);
  return in_EAX;
}

Assistant:

piga_status piga_clients_map_remove(piga_clients_map* map, int shm_key)
{
    for(size_t i = 0; i < PIGA_CLIENTS_MAP_ITEM_NUMBER; ++i) {
        if(map->items[i].queue == 0) {
            if(piga_clients_map_item_get_shm_key(&map->items[i]) == shm_key) {
                // Disconnect the queue
                piga_event_queue_disconnect_from_shm(piga_clients_map_item_get_queue(&map->items[i]));
                
                // Remove the item from the map.
                map->items[i].queue = 0;
                map->items[i].shm_key = 0;
            }
        }
    }
}